

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall runtime::VirtualMachine::Read(VirtualMachine *this)

{
  string *val;
  string *ret;
  string local_30 [8];
  string read;
  VirtualMachine *this_local;
  
  read.field_2._8_8_ = this;
  std::__cxx11::string::string(local_30);
  std::getline<char,std::char_traits<char>,std::allocator<char>>(this->in,local_30);
  val = Heap::NewString_abi_cxx11_(&this->heap);
  std::__cxx11::string::assign((string *)val);
  pushString(this,val);
  advance(this);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void runtime::VirtualMachine::Read() {
  std::string read;
  std::getline(this->in, read);
  auto ret = this->heap.NewString();
  ret->assign(read);
  this->pushString(ret);
  this->advance();
}